

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::Compaction::AddInputDeletions(Compaction *this,VersionEdit *edit)

{
  size_type sVar1;
  VersionEdit *in_RSI;
  long in_RDI;
  size_t i;
  int which;
  ulong uVar2;
  ulong __n;
  int level;
  
  for (level = 0; level < 2; level = level + 1) {
    uVar2 = 0;
    while( true ) {
      __n = uVar2;
      sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)(in_RDI + 0xc0 + (long)level * 0x18));
      if (sVar1 <= uVar2) break;
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 (in_RDI + 0xc0 + (long)level * 0x18),__n);
      VersionEdit::DeleteFile(in_RSI,level,__n);
      uVar2 = __n + 1;
    }
  }
  return;
}

Assistant:

void Compaction::AddInputDeletions(VersionEdit* edit) {
  for (int which = 0; which < 2; which++) {
    for (size_t i = 0; i < inputs_[which].size(); i++) {
      edit->DeleteFile(level_ + which, inputs_[which][i]->number);
    }
  }
}